

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall
Fixpp::impl::FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>>::operator()
          (FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>> *this,
          FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_> *field,ParsingContext *context,
          TagSet<Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<290U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
          *param_3,bool param_4,bool param_5)

{
  StreamCursor *this_00;
  long lVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  StreamBuf<char> *pSVar8;
  
  this_00 = context->cursor;
  pSVar8 = this_00->buf;
  lVar1 = *(long *)&pSVar8->field_0x8;
  pcVar2 = *(char **)&pSVar8->field_0x10;
  pcVar5 = pcVar2;
  while( true ) {
    pcVar7 = *(char **)&pSVar8->field_0x18;
    if (pcVar7 == pcVar5) {
      lVar6 = (**(code **)(*(long *)pSVar8 + 0x38))();
      if (lVar6 == 0) {
        ParsingContext::setError(context,ParsingError,"Expected value after tag %d, got EOF",0x11a);
        return;
      }
      pSVar8 = this_00->buf;
      pcVar5 = *(char **)&pSVar8->field_0x10;
      pcVar7 = *(char **)&pSVar8->field_0x18;
    }
    if (pcVar5 < pcVar7) {
      cVar4 = *pcVar5;
    }
    else {
      cVar4 = (**(code **)(*(long *)pSVar8 + 0x48))();
    }
    if (cVar4 == '|') break;
    StreamCursor::advance(this_00,1);
    pSVar8 = this_00->buf;
    pcVar5 = *(char **)&pSVar8->field_0x10;
  }
  lVar6 = *(long *)&this_00->buf->field_0x10;
  lVar3 = *(long *)&this_00->buf->field_0x8;
  (field->m_view).first = pcVar2;
  (field->m_view).second = (lVar1 + lVar6) - (long)(pcVar2 + lVar3);
  return;
}

Assistant:

void operator()(Field& field,
                            ParsingContext& context, TagSet&, bool, bool)
            {
                static constexpr auto Tag = Field::Tag::Id;
                auto& cursor = context.cursor;

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", Tag);

                auto view = valueToken.view();

                field.set(view);
            }